

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fast-dtoa.cc
# Opt level: O2

void TestFastDtoaShortestVariousFloats(void)

{
  bool bVar1;
  undefined1 uVar2;
  int requested_digits;
  int *piVar5;
  int *piVar6;
  Vector<char> buffer;
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  Vector<char> buffer_02;
  Vector<char> buffer_03;
  Vector<char> buffer_04;
  Vector<char> buffer_05;
  Vector<char> buffer_06;
  Vector<char> buffer_07;
  Vector<char> buffer_08;
  int *in_stack_ffffffffffffff58;
  int point;
  int length;
  char buffer_container [100];
  int *piVar3;
  int *piVar4;
  
  piVar4 = &length;
  piVar6 = &point;
  uVar2 = 100;
  buffer._8_8_ = piVar4;
  buffer.start_ = (char *)0x64;
  requested_digits = (int)buffer_container;
  piVar3 = piVar4;
  piVar5 = piVar6;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x1,1.401298464324817e-45,FAST_DTOA_SHORTEST,
                     requested_digits,buffer,piVar6,in_stack_ffffffffffffff58);
  CheckHelper((char *)0x87,0xc19e99,(char *)(ulong)bVar1,(bool)uVar2);
  CheckEqualsHelper((char *)0x88,0xc080e4,"1",buffer_container,(char *)piVar3,(char *)piVar5);
  CheckEqualsHelper((char *)0x89,0xc0d1e8,(char *)0xffffffffffffffd4,point,(char *)piVar3,
                    (int)piVar5);
  uVar2 = 100;
  buffer_00._8_8_ = piVar4;
  buffer_00.start_ = (char *)0x64;
  piVar3 = piVar4;
  piVar5 = piVar6;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x1,3.4028234663852886e+38,FAST_DTOA_SHORTEST,
                     requested_digits,buffer_00,piVar6,in_stack_ffffffffffffff58);
  CheckHelper((char *)0x8f,0xc19e99,(char *)(ulong)bVar1,(bool)uVar2);
  CheckEqualsHelper((char *)0x90,0xc0d1ec,"34028235",buffer_container,(char *)piVar3,(char *)piVar5)
  ;
  CheckEqualsHelper((char *)0x91,0xc1dd0f,(char *)0x27,point,(char *)piVar3,(int)piVar5);
  uVar2 = 100;
  buffer_01._8_8_ = piVar4;
  buffer_01.start_ = (char *)0x64;
  piVar3 = piVar4;
  piVar5 = piVar6;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x1,4294967296.0,FAST_DTOA_SHORTEST,requested_digits,
                     buffer_01,piVar6,in_stack_ffffffffffffff58);
  CheckHelper((char *)0x95,0xc19e99,(char *)(ulong)bVar1,(bool)uVar2);
  CheckEqualsHelper((char *)0x96,0xc0d200,"42949673",buffer_container,(char *)piVar3,(char *)piVar5)
  ;
  CheckEqualsHelper((char *)0x97,0xc0df44,(char *)0xa,point,(char *)piVar3,(int)piVar5);
  uVar2 = 100;
  buffer_02._8_8_ = piVar4;
  buffer_02.start_ = (char *)0x64;
  piVar3 = piVar4;
  piVar5 = piVar6;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x1,3.32306998946229e+35,FAST_DTOA_SHORTEST,
                     requested_digits,buffer_02,piVar6,in_stack_ffffffffffffff58);
  CheckHelper((char *)0x9b,0xc19e99,(char *)(ulong)bVar1,(bool)uVar2);
  CheckEqualsHelper((char *)0x9c,0xc0d214,"332307",buffer_container,(char *)piVar3,(char *)piVar5);
  CheckEqualsHelper((char *)0x9d,0x955419,(char *)0x24,point,(char *)piVar3,(int)piVar5);
  uVar2 = 100;
  buffer_03._8_8_ = piVar4;
  buffer_03.start_ = (char *)0x64;
  piVar3 = piVar4;
  piVar5 = piVar6;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x1,1.2341235575308664e-41,FAST_DTOA_SHORTEST,
                     requested_digits,buffer_03,piVar6,in_stack_ffffffffffffff58);
  CheckHelper((char *)0xa1,0xc19e99,(char *)(ulong)bVar1,(bool)uVar2);
  CheckEqualsHelper((char *)0xa2,0xc0d224,"12341",buffer_container,(char *)piVar3,(char *)piVar5);
  CheckEqualsHelper((char *)0xa3,0xc0d22c,(char *)0xffffffffffffffd8,point,(char *)piVar3,
                    (int)piVar5);
  uVar2 = 100;
  buffer_04._8_8_ = piVar4;
  buffer_04.start_ = (char *)0x64;
  piVar3 = piVar4;
  piVar5 = piVar6;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x1,33554432.0,FAST_DTOA_SHORTEST,requested_digits,
                     buffer_04,piVar6,in_stack_ffffffffffffff58);
  CheckHelper((char *)0xa7,0xc19e99,(char *)(ulong)bVar1,(bool)uVar2);
  CheckEqualsHelper((char *)0xa8,0xc0d230,"33554432",buffer_container,(char *)piVar3,(char *)piVar5)
  ;
  CheckEqualsHelper((char *)0xa9,0xc12bb5,(char *)0x8,point,(char *)piVar3,(int)piVar5);
  uVar2 = 100;
  buffer_05._8_8_ = piVar4;
  buffer_05.start_ = (char *)0x64;
  piVar3 = piVar4;
  piVar5 = piVar6;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x1,326494756798464.0,FAST_DTOA_SHORTEST,requested_digits,
                     buffer_05,piVar6,in_stack_ffffffffffffff58);
  CheckHelper((char *)0xad,0xc19e99,(char *)(ulong)bVar1,(bool)uVar2);
  CheckEqualsHelper((char *)0xae,0xc0d244,"32649476",buffer_container,(char *)piVar3,(char *)piVar5)
  ;
  CheckEqualsHelper((char *)0xaf,0xc1aa69,(char *)0xf,point,(char *)piVar3,(int)piVar5);
  buffer_06._8_8_ = piVar4;
  buffer_06.start_ = (char *)0x64;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x1,3.9113222363777194e+37,FAST_DTOA_SHORTEST,
                     requested_digits,buffer_06,piVar6,in_stack_ffffffffffffff58);
  if (bVar1) {
    CheckEqualsHelper((char *)0xb4,0xc0d24f,"39113222",buffer_container,(char *)piVar4,
                      (char *)piVar6);
    CheckEqualsHelper((char *)0xb5,0xa52039,(char *)0x26,point,(char *)piVar4,(int)piVar6);
  }
  piVar4 = &length;
  piVar6 = &point;
  buffer_07._8_8_ = piVar4;
  buffer_07.start_ = (char *)0x64;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x1,1.1754943508222875e-38,FAST_DTOA_SHORTEST,
                     (int)buffer_container,buffer_07,piVar6,in_stack_ffffffffffffff58);
  if (bVar1) {
    CheckEqualsHelper((char *)0xbc,0xc0d263,"11754944",buffer_container,(char *)piVar4,
                      (char *)piVar6);
    CheckEqualsHelper((char *)0xbd,0xc0d277,(char *)0xffffffffffffffdb,point,(char *)piVar4,
                      (int)piVar6);
  }
  uVar2 = 100;
  piVar4 = &length;
  piVar6 = &point;
  buffer_08._8_8_ = piVar4;
  buffer_08.start_ = (char *)0x64;
  bVar1 = double_conversion::FastDtoa
                    ((double_conversion *)0x1,1.1754942106924411e-38,FAST_DTOA_SHORTEST,
                     (int)buffer_container,buffer_08,piVar6,in_stack_ffffffffffffff58);
  CheckHelper((char *)0xc3,0xc19e99,(char *)(ulong)bVar1,(bool)uVar2);
  CheckEqualsHelper((char *)0xc4,0xc0d27b,"11754942",buffer_container,(char *)piVar4,(char *)piVar6)
  ;
  CheckEqualsHelper((char *)0xc5,0xc0d277,(char *)0xffffffffffffffdb,point,(char *)piVar4,
                    (int)piVar6);
  return;
}

Assistant:

TEST(FastDtoaShortestVariousFloats) {
  char buffer_container[kBufferSize];
  Vector<char> buffer(buffer_container, kBufferSize);
  int length;
  int point;
  bool status;

  float min_float = 1e-45f;
  status = FastDtoa(min_float, FAST_DTOA_SHORTEST_SINGLE, 0,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("1", buffer.start());
  CHECK_EQ(-44, point);


  float max_float = 3.4028234e38f;
  status = FastDtoa(max_float, FAST_DTOA_SHORTEST_SINGLE, 0,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("34028235", buffer.start());
  CHECK_EQ(39, point);

  status = FastDtoa(4294967272.0f, FAST_DTOA_SHORTEST_SINGLE, 0,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("42949673", buffer.start());
  CHECK_EQ(10, point);

  status = FastDtoa(3.32306998946228968226e+35f, FAST_DTOA_SHORTEST_SINGLE, 0,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("332307", buffer.start());
  CHECK_EQ(36, point);

  status = FastDtoa(1.2341e-41f, FAST_DTOA_SHORTEST_SINGLE, 0,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("12341", buffer.start());
  CHECK_EQ(-40, point);

  status = FastDtoa(3.3554432e7, FAST_DTOA_SHORTEST_SINGLE, 0,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("33554432", buffer.start());
  CHECK_EQ(8, point);

  status = FastDtoa(3.26494756798464e14f, FAST_DTOA_SHORTEST_SINGLE, 0,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("32649476", buffer.start());
  CHECK_EQ(15, point);

  status = FastDtoa(3.91132223637771935344e37f, FAST_DTOA_SHORTEST_SINGLE, 0,
                    buffer, &length, &point);
  if (status) {  // Not all FastDtoa variants manage to compute this number.
    CHECK_EQ("39113222", buffer.start());
    CHECK_EQ(38, point);
  }

  uint32_t smallest_normal32 = 0x00800000;
  float v = Single(smallest_normal32).value();
  status = FastDtoa(v, FAST_DTOA_SHORTEST_SINGLE, 0, buffer, &length, &point);
  if (status) {
    CHECK_EQ("11754944", buffer.start());
    CHECK_EQ(-37, point);
  }

  uint32_t largest_denormal32 = 0x007FFFFF;
  v = Single(largest_denormal32).value();
  status = FastDtoa(v, FAST_DTOA_SHORTEST_SINGLE, 0, buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("11754942", buffer.start());
  CHECK_EQ(-37, point);
}